

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound_linux_alsa.cpp
# Opt level: O1

void __thiscall YsSoundPlayer::APISpecificData::PrintState(APISpecificData *this,int errCode)

{
  uint uVar1;
  char *__s;
  
  if (errCode < 0x20) {
    if (errCode == 0) goto LAB_00113b75;
    if (errCode == 0xb) {
      __s = "EAGAIN";
    }
    else {
LAB_00113b69:
      __s = "Unknown error.";
    }
  }
  else if (errCode == 0x56) {
    __s = "ESTRPIPE";
  }
  else if (errCode == 0x4d) {
    __s = "EBADFD";
  }
  else {
    if (errCode != 0x20) goto LAB_00113b69;
    __s = "EPIPE";
  }
  puts(__s);
LAB_00113b75:
  uVar1 = snd_pcm_state(this->handle);
  if (uVar1 < 9) {
    puts(&DAT_00117c8c + *(int *)(&DAT_00117c8c + (ulong)uVar1 * 4));
    return;
  }
  return;
}

Assistant:

void YsSoundPlayer::APISpecificData::PrintState(int errCode)
{
	if(0==errCode)
	{
	}
	else if(EBADFD==errCode)
	{
		printf("EBADFD\n");
	}
	else if(EPIPE==errCode)
	{
		printf("EPIPE\n");
	}
	else if(ESTRPIPE==errCode)
	{
		printf("ESTRPIPE\n");
	}
	else if(EAGAIN==errCode)
	{
		printf("EAGAIN\n");
	}
	else
	{
		printf("Unknown error.\n");
	}

	snd_pcm_state_t state=snd_pcm_state(handle);
	switch(state)
	{
	case SND_PCM_STATE_OPEN:
		printf("SND_PCM_STATE_OPEN\n");
		break;
	case SND_PCM_STATE_SETUP:
		printf("SND_PCM_STATE_SETUP\n");
		break;
	case SND_PCM_STATE_PREPARED:
		printf("SND_PCM_STATE_PREPARED\n");
		break;
	case SND_PCM_STATE_RUNNING:
		printf("SND_PCM_STATE_RUNNING\n");
		break;
	case SND_PCM_STATE_XRUN:
		printf("SND_PCM_STATE_XRUN\n");
		break;
	case SND_PCM_STATE_DRAINING:
		printf("SND_PCM_STATE_DRAINING\n");
		break;
	case SND_PCM_STATE_PAUSED:
		printf("SND_PCM_STATE_PAUSED\n");
		break;
	case SND_PCM_STATE_SUSPENDED:
		printf("SND_PCM_STATE_SUSPENDED\n");
		break;
	case SND_PCM_STATE_DISCONNECTED:
		printf("SND_PCM_STATE_DISCONNECTED\n");
		break;
	}
}